

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O1

void __thiscall embree::Tutorial::postParseCommandLine(Tutorial *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GroupNode *pGVar2;
  ParseStream *this_00;
  LineCommentFilter *this_01;
  FileName file;
  Ref<embree::Stream<int>_> local_e0;
  Ref<embree::ParseStream> local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  FileName local_70;
  FileName local_50;
  
  if ((ulong)shader < 0xb) {
    renderFrame = (&PTR_renderFrameStandard_002cced0)[shader];
  }
  pGVar2 = (this->super_SceneLoadingTutorialApplication).scene.ptr;
  if ((((pGVar2->children).
        super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (pGVar2->children).
        super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start) &&
      ((this->super_SceneLoadingTutorialApplication).sceneFilename.
       super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (this->super_SceneLoadingTutorialApplication).sceneFilename.
       super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>._M_impl.
       super__Vector_impl_data._M_start)) &&
     ((this->super_SceneLoadingTutorialApplication).futures.
      super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->super_SceneLoadingTutorialApplication).futures.
      super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    FileName::executableFolder();
    FileName::FileName((FileName *)&local_b0,"models/cornell_box.ecs");
    FileName::operator+(&local_70,(FileName *)&local_d0,(FileName *)&local_b0);
    paVar1 = &local_b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    this_00 = (ParseStream *)operator_new(0x48);
    this_01 = (LineCommentFilter *)operator_new(0x68);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"#","");
    LineCommentFilter::LineCommentFilter(this_01,&local_70,&local_d0);
    local_e0.ptr = (Stream<int> *)this_01;
    (*(this_01->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this_01);
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\n\t\r ","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    ParseStream::ParseStream(this_00,&local_e0,&local_b0,&local_90,false);
    local_d8.ptr = this_00;
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
    FileName::path(&local_50,&local_70);
    Application::parseCommandLine((Application *)this,&local_d8,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.filename._M_dataplus._M_p != &local_50.filename.field_2) {
      operator_delete(local_50.filename._M_dataplus._M_p);
    }
    if (local_d8.ptr != (ParseStream *)0x0) {
      (*((local_d8.ptr)->
        super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super_RefCount._vptr_RefCount[3])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((LineCommentFilter *)local_e0.ptr != (LineCommentFilter *)0x0) {
      (*(((Stream<int> *)&(local_e0.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.filename._M_dataplus._M_p != &local_70.filename.field_2) {
      operator_delete(local_70.filename._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void postParseCommandLine() override
    {
      /* set shader mode */
      switch (shader) {
      case SHADER_DEFAULT  : renderFrame = renderFrameStandard; break;
      case SHADER_EYELIGHT : renderFrame = renderFrameDebugShader; break;
      case SHADER_OCCLUSION: renderFrame = renderFrameDebugShader; break;
      case SHADER_UV       : renderFrame = renderFrameDebugShader; break;
      case SHADER_TEXCOORDS: renderFrame = renderFrameDebugShader; break;
      case SHADER_TEXCOORDS_GRID: renderFrame = renderFrameDebugShader; break;
      case SHADER_NG       : renderFrame = renderFrameDebugShader; break;
      case SHADER_CYCLES   : renderFrame = renderFrameDebugShader; break;
      case SHADER_GEOMID   : renderFrame = renderFrameDebugShader; break;
      case SHADER_GEOMID_PRIMID: renderFrame = renderFrameDebugShader; break;
      case SHADER_AO: renderFrame = renderFrameAOShader; break;      
      };
      
      /* load default scene if none specified */
      if (scene_empty_post_parse()) {
        FileName file = FileName::executableFolder() + FileName("models/cornell_box.ecs");
        parseCommandLine(new ParseStream(new LineCommentFilter(file, "#")), file.path());
      }
    }